

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextTests.cpp
# Opt level: O1

void __thiscall
solitaire::ContextTests_throwOnInvalidFoundationPileColliderId_Test::TestBody
          (ContextTests_throwOnInvalidFoundationPileColliderId_Test *this)

{
  bool bVar1;
  TrueWithString gtest_msg;
  AssertHelper local_70;
  long *local_68;
  char *pcStack_60;
  long local_58 [2];
  Message local_48 [4];
  undefined4 local_28;
  undefined4 local_24;
  
  local_58[1] = 0;
  pcStack_60 = (char *)0x0;
  local_58[0] = 0;
  local_68 = local_58;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_24 = 4;
    (*(((this->super_ContextTests).context._M_t.
        super___uniq_ptr_impl<solitaire::Context,_std::default_delete<solitaire::Context>_>._M_t.
        super__Tuple_impl<0UL,_solitaire::Context_*,_std::default_delete<solitaire::Context>_>.
        super__Head_base<0UL,_solitaire::Context_*,_false>._M_head_impl)->super_Context).
      _vptr_Context[6])();
  }
  std::__cxx11::string::_M_replace((ulong)&local_68,0,pcStack_60,0x274d9d);
  testing::Message::Message(local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ContextTests.cpp"
             ,0x53,(char *)local_68);
  testing::internal::AssertHelper::operator=(&local_70,local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_48[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_48[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_58[1] = 0;
  pcStack_60 = (char *)0x0;
  local_58[0] = 0;
  local_68 = local_58;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_28 = 4;
    (*(((this->super_ContextTests).context._M_t.
        super___uniq_ptr_impl<solitaire::Context,_std::default_delete<solitaire::Context>_>._M_t.
        super__Tuple_impl<0UL,_solitaire::Context_*,_std::default_delete<solitaire::Context>_>.
        super__Head_base<0UL,_solitaire::Context_*,_false>._M_head_impl)->super_Context).
      _vptr_Context[7])();
  }
  std::__cxx11::string::_M_replace((ulong)&local_68,0,pcStack_60,0x274f87);
  testing::Message::Message(local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ContextTests.cpp"
             ,0x58,(char *)local_68);
  testing::internal::AssertHelper::operator=(&local_70,local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_48[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_48[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

TEST_F(ContextTests, throwOnInvalidFoundationPileColliderId) {
    EXPECT_THROW(
        context->getFoundationPileCollider(PileId {foundationPilesCount}),
        std::runtime_error
    );

    EXPECT_THROW(
        std::as_const(*context).getFoundationPileCollider(PileId {foundationPilesCount}),
        std::runtime_error
    );
}